

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void drawSceneNodeRecursive(cgltf_node *node,mat4 *viewProj,mat4 *parentMat)

{
  size_t sVar1;
  glm *this;
  mat<4,_4,_float,_(glm::qualifier)0> *m2;
  cgltf_primitive *pcVar2;
  cgltf_node **ppcVar3;
  cgltf_material *local_1250;
  cgltf_node *child;
  cgltf_node **__end1;
  cgltf_node **__begin1;
  CSpan<cgltf_node_*> *__range1;
  CSpan<cgltf_node_*> children;
  ShaderData *shader;
  anon_class_40_5_db77c043 uploadCommonUniforms;
  anon_class_32_4_ac14507d draw;
  cgltf_material *material;
  u32 vao;
  cgltf_primitive *prim;
  size_t i_1;
  u32 *vaos;
  CSpan<cgltf_primitive> primitives;
  mat4 modelViewProj;
  mat3 modelMat3;
  mat<4,_4,_float,_(glm::qualifier)0> local_10d8;
  mat<4,_4,_float,_(glm::qualifier)0> *local_1098;
  mat4 *invBindMtx;
  size_t jointNodeInd;
  cgltf_node *joint;
  size_t i;
  mat4 modelMatInv;
  mat4 jointMatrices [64];
  int numJoints;
  int skinning;
  mat4 *modelMat;
  i32 nodeInd;
  mat4 *parentMat_local;
  mat4 *viewProj_local;
  cgltf_node *node_local;
  
  sVar1 = getNodeInd(node);
  this = (glm *)tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                          ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices
                           ,(long)(int)sVar1);
  if (node->mesh != (cgltf_mesh *)0x0) {
    jointMatrices[0x3f].value[3].field_3._1_3_ = 0;
    jointMatrices[0x3f].value[3].field_3._0_1_ = node->skin != (cgltf_skin *)0x0;
    jointMatrices[0x3f].value[3].field_2.z = 0.0;
    if (node->skin != (cgltf_skin *)0x0) {
      jointMatrices[0x3f].value[3].field_2 = SUB84(node->skin->joints_count,0);
      glm::affineInverse<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)&i,this,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)node->skin);
      for (joint = (cgltf_node *)0x0;
          joint < (cgltf_node *)(long)(int)jointMatrices[0x3f].value[3].field_2;
          joint = (cgltf_node *)((long)&joint->name + 1)) {
        jointNodeInd = (size_t)node->skin->joints[(long)joint];
        invBindMtx = (mat4 *)getNodeInd((cgltf_node *)jointNodeInd);
        local_1098 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                     cgltfAccessAccessor(node->skin->inverse_bind_matrices,(cgltf_size)joint);
        m2 = tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                       ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,
                        (size_t)invBindMtx);
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&modelMat3.value[2].field_1,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&i,m2);
        glm::operator*(&local_10d8,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&modelMat3.value[2].field_1,local_1098
                      );
        memcpy(&jointMatrices[(long)((long)&joint[-1].extras.end_offset + 7)].value[3].field_2,
               &local_10d8,0x40);
      }
    }
    glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
              ((mat<3,_3,_float,_(glm::qualifier)0> *)&modelViewProj.value[3].field_2,
               (mat<4,_4,_float,_(glm::qualifier)0> *)this);
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)((long)&primitives._size + 4),viewProj,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)this);
    tl::Span<const_cgltf_primitive>::Span
              ((Span<const_cgltf_primitive> *)&vaos,node->mesh->primitives,
               node->mesh->primitives_count);
    tl::FVector<unsigned_int,_128UL>::begin((FVector<unsigned_int,_128UL> *)gpu::vaos);
    sVar1 = getMeshInd(node->mesh);
    tl::FVector<unsigned_int,_1024UL>::operator[]
              ((FVector<unsigned_int,_1024UL> *)gpu::meshPrimsVaos,sVar1);
    for (prim = (cgltf_primitive *)0x0;
        pcVar2 = (cgltf_primitive *)
                 tl::Span<const_cgltf_primitive>::size((Span<const_cgltf_primitive> *)&vaos),
        prim < pcVar2; prim = (cgltf_primitive *)((long)&prim->type + 1)) {
      pcVar2 = tl::Span<const_cgltf_primitive>::operator[]
                         ((Span<const_cgltf_primitive> *)&vaos,(size_t)prim);
      if (pcVar2->material == (cgltf_material *)0x0) {
        local_1250 = &s_defaultMaterial;
      }
      else {
        local_1250 = pcVar2->material;
      }
      uploadCommonUniforms.jointMatrices = (mat4 (*) [64])local_1250;
      shader = (ShaderData *)((long)&primitives._size + 4);
      uploadCommonUniforms.modelViewProj = (mat4 *)&modelViewProj.value[3].field_2;
      uploadCommonUniforms.modelMat3 = (mat3 *)&jointMatrices[0x3f].value[3].field_3;
      uploadCommonUniforms.skinning = (int *)&jointMatrices[0x3f].value[3].field_2;
      uploadCommonUniforms.numJoints = (int *)&modelMatInv.value[3].field_2;
      if (local_1250->has_pbr_metallic_roughness == 0) {
        __assert_fail("false && \"type of material not supported\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x37a,
                      "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                     );
      }
      children._size = (size_t)gpu::shaderPbrMetallic((int)jointMatrices[0x3f].value[3].field_3);
      (*glad_debug_glUseProgram)(((ShaderData *)children._size)->prog);
      drawSceneNodeRecursive::anon_class_40_5_db77c043::operator()
                ((anon_class_40_5_db77c043 *)&shader,(ShaderData *)children._size);
      drawSceneNodeRecursive::anon_class_32_4_ac14507d::operator()
                ((anon_class_32_4_ac14507d *)&uploadCommonUniforms.jointMatrices);
    }
  }
  tl::Span<cgltf_node_*const>::Span
            ((Span<cgltf_node_*const> *)&__range1,node->children,node->children_count);
  __end1 = tl::Span<cgltf_node_*const>::begin((Span<cgltf_node_*const> *)&__range1);
  ppcVar3 = tl::Span<cgltf_node_*const>::end((Span<cgltf_node_*const> *)&__range1);
  while( true ) {
    if (__end1 == ppcVar3) {
      return;
    }
    if (*__end1 == (cgltf_node *)0x0) break;
    drawSceneNodeRecursive(*__end1,viewProj,(mat4 *)this);
    __end1 = __end1 + 1;
  }
  __assert_fail("child",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                ,0x381,
                "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
               );
}

Assistant:

static void drawSceneNodeRecursive(const cgltf_node& node, const glm::mat4& viewProj,
    const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const glm::mat4& modelMat = anims::nodesMatrices[nodeInd];

    if(node.mesh)
    {
        const int skinning = node.skin ? 1 : 0;
        int numJoints = 0;
        glm::mat4 jointMatrices[MAX_NUM_JOINTS];
        if(node.skin) {
            numJoints = node.skin->joints_count;
            const glm::mat4 modelMatInv = glm::affineInverse(modelMat);
            for(size_t i = 0; i < numJoints; i++) {
                const cgltf_node& joint = *node.skin->joints[i];
                const size_t jointNodeInd = getNodeInd(&joint);
                const glm::mat4& invBindMtx = *(const glm::mat4*)cgltfAccessAccessor(*node.skin->inverse_bind_matrices, i);
                jointMatrices[i] =
                    modelMatInv *
                    anims::nodesMatrices[jointNodeInd] *
                    invBindMtx;
            }
        }

        const glm::mat3 modelMat3 = modelMat;
        const glm::mat4 modelViewProj = viewProj * modelMat;
        CSpan<cgltf_primitive> primitives(node.mesh->primitives, node.mesh->primitives_count);
        const u32* vaos = gpu::vaos.begin() + gpu::meshPrimsVaos[getMeshInd(node.mesh)];
        for(size_t i = 0; i < primitives.size(); i++)
        {
            const cgltf_primitive& prim = primitives[i];
            const u32 vao = vaos[i];
            const auto& material = prim.material ? *prim.material : s_defaultMaterial;

            auto draw = [&]
            {
                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::ALBEDO);
                if(material.has_pbr_metallic_roughness) {
                    glUniform4fv(gpu::shaderPbrMetallic(skinning).unifLocs.color,
                                 1, material.pbr_metallic_roughness.base_color_factor);
                    if(auto tex = material.pbr_metallic_roughness.base_color_texture.texture)
                        glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                    else
                        glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
                }
                else if(material.has_pbr_specular_glossiness) {
                    assert("todo" && false);
                }

                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::NORMAL);
                if(auto tex = material.normal_texture.texture)
                    glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                else
                    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);

                glBindVertexArray(vao);
                if(prim.indices) {
                    glDrawElements(
                       cgltfPrimTypeToGl(prim.type),
                       prim.indices->count,
                       cgltfComponentTypeToGl(prim.indices->component_type),
                       (void*)(prim.indices->buffer_view->offset + prim.indices->offset)
                    );
                }
                else {
                    glDrawArrays(cgltfPrimTypeToGl(prim.type), 0, prim.attributes->data->count);
                }
            };
            auto uploadCommonUniforms = [&](const ShaderData& shader)
            {
                glUniformMatrix4fv(shader.unifLocs.modelViewProj, 1, GL_FALSE, &modelViewProj[0][0]);
                glUniformMatrix3fv(shader.unifLocs.modelMat3, 1, GL_FALSE, &modelMat3[0][0]);
                if(skinning)
                    glUniformMatrix4fv(shader.unifLocs.jointMatrices, numJoints, GL_FALSE, &jointMatrices[0][0][0]);
            };

            if(material.has_pbr_metallic_roughness)
            {
                auto& shader = gpu::shaderPbrMetallic(skinning);
                glUseProgram(shader.prog);
                uploadCommonUniforms(shader);
                draw();
            }
            else {
                assert(false && "type of material not supported");
            }
        }
    }

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        drawSceneNodeRecursive(*child, viewProj, modelMat);
    }
}